

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O1

Variant * __thiscall
Jinx::Impl::Script::CallNativeFunction
          (Variant *__return_storage_ptr__,Script *this,FunctionDefinitionPtr *fnDef)

{
  size_t sVar1;
  long lVar2;
  Variant *this_00;
  size_t sVar3;
  Parameters params;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> local_88;
  Variant *local_68;
  shared_ptr<Jinx::IScript> local_60;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_88.super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar1 = ((fnDef->super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr)->m_parameterCount;
  if (sVar1 != 0) {
    lVar2 = sVar1 * -0x28;
    sVar3 = sVar1;
    local_68 = __return_storage_ptr__;
    do {
      std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::push_back
                (&local_88,
                 (value_type *)
                 ((long)&((this->m_stack).
                          super__Vector_base<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->m_type + lVar2));
      __return_storage_ptr__ = local_68;
      lVar2 = lVar2 + 0x28;
      sVar3 = sVar3 - 1;
    } while (sVar3 != 0);
    do {
      this_00 = (this->m_stack).
                super__Vector_base<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1;
      (this->m_stack).
      super__Vector_base<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>._M_impl
      .super__Vector_impl_data._M_finish = this_00;
      Variant::Destroy(this_00);
      sVar1 = sVar1 - 1;
    } while (sVar1 != 0);
  }
  std::
  function<Jinx::Variant_(std::shared_ptr<Jinx::IScript>,_const_std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>_&)>
  ::function((function<Jinx::Variant_(std::shared_ptr<Jinx::IScript>,_const_std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>_&)>
              *)&local_50,
             &((fnDef->
               super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->m_callback);
  std::__shared_ptr<Jinx::Impl::Script,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Jinx::Impl::Script,void>
            ((__shared_ptr<Jinx::Impl::Script,(__gnu_cxx::_Lock_policy)2> *)&local_98,
             (__weak_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<Jinx::Impl::Script>);
  local_60.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_98;
  local_60.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Stack_90;
  local_98 = (element_type *)0x0;
  p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (local_40 == (code *)0x0) {
    std::__throw_bad_function_call();
  }
  (*local_38)(__return_storage_ptr__,&local_50,&local_60,&local_88);
  if (local_60.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_60.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
  }
  if (local_40 != (code *)0x0) {
    (*local_40)((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
  }
  std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::~vector(&local_88);
  return __return_storage_ptr__;
}

Assistant:

inline Variant Script::CallNativeFunction(const FunctionDefinitionPtr & fnDef)
	{
		Parameters params;
		size_t numParams = fnDef->GetParameterCount();
		for (size_t i = 0; i < numParams; ++i)
		{
			size_t index = m_stack.size() - (numParams - i);
			const auto & param = m_stack[index];
			params.push_back(param);
		}
		for (size_t i = 0; i < numParams; ++i)
			m_stack.pop_back();
		return fnDef->GetCallback()(shared_from_this(), params);
	}